

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

SyntaxKind slang::syntax::SyntaxFacts::getBinarySequenceExpr(TokenKind kind)

{
  TokenKind kind_local;
  undefined4 local_4;
  
  if (kind == AndKeyword) {
    local_4 = AndSequenceExpr;
  }
  else if (kind == IntersectKeyword) {
    local_4 = IntersectSequenceExpr;
  }
  else if (kind == OrKeyword) {
    local_4 = OrSequenceExpr;
  }
  else if (kind == ThroughoutKeyword) {
    local_4 = ThroughoutSequenceExpr;
  }
  else if (kind == WithinKeyword) {
    local_4 = WithinSequenceExpr;
  }
  else {
    local_4 = Unknown;
  }
  return local_4;
}

Assistant:

SyntaxKind SyntaxFacts::getBinarySequenceExpr(TokenKind kind) {
    switch (kind) {
        case TokenKind::AndKeyword: return SyntaxKind::AndSequenceExpr;
        case TokenKind::OrKeyword: return SyntaxKind::OrSequenceExpr;
        case TokenKind::IntersectKeyword: return SyntaxKind::IntersectSequenceExpr;
        case TokenKind::ThroughoutKeyword: return SyntaxKind::ThroughoutSequenceExpr;
        case TokenKind::WithinKeyword: return SyntaxKind::WithinSequenceExpr;
        default: return SyntaxKind::Unknown;
    }
}